

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

LookUpTableQuantizationParams * __thiscall
CoreML::Specification::LookUpTableQuantizationParams::New
          (LookUpTableQuantizationParams *this,Arena *arena)

{
  LookUpTableQuantizationParams *this_00;
  
  this_00 = (LookUpTableQuantizationParams *)operator_new(0x28);
  LookUpTableQuantizationParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LookUpTableQuantizationParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

LookUpTableQuantizationParams* LookUpTableQuantizationParams::New(::google::protobuf::Arena* arena) const {
  LookUpTableQuantizationParams* n = new LookUpTableQuantizationParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}